

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_key.cpp
# Opt level: O0

OutputPrivkeyDataStruct *
cfd::js::api::KeyStructApi::NegatePrivkey
          (OutputPrivkeyDataStruct *__return_storage_ptr__,PrivkeyDataStruct *request)

{
  PrivkeyDataStruct *this;
  string *in_R8;
  allocator local_129;
  function<cfd::js::api::OutputPrivkeyDataStruct_(const_cfd::js::api::PrivkeyDataStruct_&)>
  local_128;
  undefined1 local_108 [238];
  undefined1 local_1a;
  anon_class_1_0_00000001 local_19;
  PrivkeyDataStruct *pPStack_18;
  anon_class_1_0_00000001 call_func;
  PrivkeyDataStruct *request_local;
  OutputPrivkeyDataStruct *result;
  
  local_1a = 0;
  pPStack_18 = request;
  OutputPrivkeyDataStruct::OutputPrivkeyDataStruct(__return_storage_ptr__);
  this = pPStack_18;
  std::function<cfd::js::api::OutputPrivkeyDataStruct(cfd::js::api::PrivkeyDataStruct_const&)>::
  function<cfd::js::api::KeyStructApi::NegatePrivkey(cfd::js::api::PrivkeyDataStruct_const&)::__0&,void>
            ((function<cfd::js::api::OutputPrivkeyDataStruct(cfd::js::api::PrivkeyDataStruct_const&)>
              *)local_108,&local_19);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_128,"NegatePrivkey",&local_129);
  ExecuteStructApi<cfd::js::api::PrivkeyDataStruct,cfd::js::api::OutputPrivkeyDataStruct>
            ((OutputPrivkeyDataStruct *)(local_108 + 0x20),(api *)this,
             (PrivkeyDataStruct *)local_108,&local_128,in_R8);
  OutputPrivkeyDataStruct::operator=
            (__return_storage_ptr__,(OutputPrivkeyDataStruct *)(local_108 + 0x20));
  OutputPrivkeyDataStruct::~OutputPrivkeyDataStruct((OutputPrivkeyDataStruct *)(local_108 + 0x20));
  std::__cxx11::string::~string((string *)&local_128);
  std::allocator<char>::~allocator((allocator<char> *)&local_129);
  std::function<cfd::js::api::OutputPrivkeyDataStruct_(const_cfd::js::api::PrivkeyDataStruct_&)>::
  ~function((function<cfd::js::api::OutputPrivkeyDataStruct_(const_cfd::js::api::PrivkeyDataStruct_&)>
             *)local_108);
  return __return_storage_ptr__;
}

Assistant:

OutputPrivkeyDataStruct KeyStructApi::NegatePrivkey(
    const PrivkeyDataStruct& request) {
  auto call_func =
      [](const PrivkeyDataStruct& request) -> OutputPrivkeyDataStruct {
    OutputPrivkeyDataStruct response;
    Privkey privkey;
    if (Privkey::HasWif(request.privkey)) {
      privkey = Privkey::FromWif(request.privkey);
    } else {
      privkey = Privkey(request.privkey);
    }
    response.privkey = privkey.CreateNegate().GetHex();
    return response;
  };

  OutputPrivkeyDataStruct result;
  result = ExecuteStructApi<PrivkeyDataStruct, OutputPrivkeyDataStruct>(
      request, call_func, std::string(__FUNCTION__));
  return result;
}